

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

ExceptionOr<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>_>
* __thiscall
kj::_::
ExceptionOr<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>_>
::operator=(ExceptionOr<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>_>
            *this,ExceptionOr<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>_>
                  *param_1)

{
  OwnPromiseNode OVar1;
  PromiseArenaMember *pPVar2;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
      OVar1.ptr = (this->value).ptr.field_1.value.impl.
                  super_TupleElement<1U,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
                  .value.super_PromiseBase.node.ptr;
      if (&(OVar1.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
        (this->value).ptr.field_1.value.impl.
        super_TupleElement<1U,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
        .value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
        PromiseDisposer::dispose(&(OVar1.ptr)->super_PromiseArenaMember);
      }
      pPVar2 = &((this->value).ptr.field_1.value.impl.
                 super_TupleElement<0U,_kj::Promise<kj::HttpClient::ConnectRequest::Status>_>.value.
                 super_PromiseBase.node.ptr)->super_PromiseArenaMember;
      if (pPVar2 != (PromiseArenaMember *)0x0) {
        (this->value).ptr.field_1.value.impl.
        super_TupleElement<0U,_kj::Promise<kj::HttpClient::ConnectRequest::Status>_>.value.
        super_PromiseBase.node.ptr = (PromiseNode *)0x0;
        PromiseDisposer::dispose(pPVar2);
      }
    }
    if ((param_1->value).ptr.isSet == true) {
      (this->value).ptr.field_1.value.impl.
      super_TupleElement<0U,_kj::Promise<kj::HttpClient::ConnectRequest::Status>_>.value.
      super_PromiseBase.node.ptr =
           (param_1->value).ptr.field_1.value.impl.
           super_TupleElement<0U,_kj::Promise<kj::HttpClient::ConnectRequest::Status>_>.value.
           super_PromiseBase.node.ptr;
      (param_1->value).ptr.field_1.value.impl.
      super_TupleElement<0U,_kj::Promise<kj::HttpClient::ConnectRequest::Status>_>.value.
      super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (this->value).ptr.field_1.value.impl.
      super_TupleElement<1U,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
      .value.super_PromiseBase.node.ptr =
           (param_1->value).ptr.field_1.value.impl.
           super_TupleElement<1U,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
           .value.super_PromiseBase.node.ptr;
      (param_1->value).ptr.field_1.value.impl.
      super_TupleElement<1U,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
      .value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (this->value).ptr.isSet = true;
    }
  }
  if ((param_1->value).ptr.isSet == true) {
    (param_1->value).ptr.isSet = false;
    OVar1.ptr = (param_1->value).ptr.field_1.value.impl.
                super_TupleElement<1U,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
                .value.super_PromiseBase.node.ptr;
    if (&(OVar1.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      (param_1->value).ptr.field_1.value.impl.
      super_TupleElement<1U,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
      .value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      PromiseDisposer::dispose(&(OVar1.ptr)->super_PromiseArenaMember);
    }
    pPVar2 = &((param_1->value).ptr.field_1.value.impl.
               super_TupleElement<0U,_kj::Promise<kj::HttpClient::ConnectRequest::Status>_>.value.
               super_PromiseBase.node.ptr)->super_PromiseArenaMember;
    if (pPVar2 != (PromiseArenaMember *)0x0) {
      (param_1->value).ptr.field_1.value.impl.
      super_TupleElement<0U,_kj::Promise<kj::HttpClient::ConnectRequest::Status>_>.value.
      super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      PromiseDisposer::dispose(pPVar2);
    }
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;